

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLoad.c
# Opt level: O2

Vec_Flt_t * Abc_SclFindWireCaps(SC_WireLoad *pWL,int nFanoutMax)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  Vec_Flt_t *p;
  float *__s;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  char *__assertion;
  int iVar8;
  int iVar9;
  float fVar10;
  float local_48;
  
  if (pWL == (SC_WireLoad *)0x0) {
    __assertion = "pWL != NULL";
    uVar4 = 0x32;
LAB_003bf69c:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLoad.c"
                  ,uVar4,"Vec_Flt_t *Abc_SclFindWireCaps(SC_WireLoad *, int)");
  }
  uVar4 = 0;
  for (iVar9 = 0; iVar3 = (pWL->vFanout).nSize, iVar9 < iVar3; iVar9 = iVar9 + 1) {
    uVar2 = Vec_IntEntry(&pWL->vFanout,iVar9);
    if ((int)uVar4 <= (int)uVar2) {
      uVar4 = uVar2;
    }
  }
  uVar6 = (ulong)uVar4;
  if ((int)uVar4 < nFanoutMax) {
    uVar6 = (ulong)(uint)nFanoutMax;
  }
  uVar4 = (uint)uVar6;
  p = (Vec_Flt_t *)malloc(0x10);
  uVar7 = 0x10;
  if (0xe < uVar4) {
    uVar7 = (ulong)(uVar4 + 1);
  }
  p->nCap = (int)uVar7;
  __s = (float *)malloc(uVar7 << 2);
  p->pArray = __s;
  p->nSize = uVar4 + 1;
  memset(__s,0,uVar6 * 4 + 4);
  for (iVar9 = 0; iVar9 < iVar3; iVar9 = iVar9 + 1) {
    iVar3 = Vec_IntEntry(&pWL->vFanout,iVar9);
    fVar10 = Vec_FltEntry(&pWL->vLen,iVar9);
    Vec_FltWriteEntry(p,iVar3,fVar10 * pWL->cap);
    iVar3 = (pWL->vFanout).nSize;
  }
  fVar10 = Vec_FltEntry(p,1);
  if ((fVar10 != 0.0) || (NAN(fVar10))) {
    fVar10 = Vec_FltEntry(p,1);
    if ((fVar10 == 0.0) && (!NAN(fVar10))) {
      __assertion = "Vec_FltEntry(vCaps, 1) != 0";
      uVar4 = 0x3e;
      goto LAB_003bf69c;
    }
    local_48 = Vec_FltEntry(p,1);
    iVar3 = 1;
    for (iVar9 = 2; iVar9 <= (int)uVar4; iVar9 = iVar9 + 1) {
      fVar10 = Vec_FltEntry(p,iVar9);
      if ((fVar10 != 0.0) || (iVar5 = iVar3, fVar1 = local_48, NAN(fVar10))) {
        for (iVar8 = 1; iVar5 = iVar9, fVar1 = fVar10, iVar3 + iVar8 < iVar9; iVar8 = iVar8 + 1) {
          Vec_FltWriteEntry(p,iVar3 + iVar8,
                            (float)iVar8 * ((fVar10 - local_48) / (float)(iVar9 - iVar3)) + local_48
                           );
        }
      }
      local_48 = fVar1;
      iVar3 = iVar5;
    }
    fVar10 = pWL->cap;
    fVar1 = pWL->slope;
    for (iVar5 = 1; iVar3 + iVar5 < iVar9; iVar5 = iVar5 + 1) {
      Vec_FltWriteEntry(p,iVar3 + iVar5,(float)iVar5 * fVar10 * fVar1 + local_48);
    }
  }
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns estimated wire capacitances for each fanout count.]

  Description []
               
  SideEffects []`

  SeeAlso     []

***********************************************************************/
Vec_Flt_t * Abc_SclFindWireCaps( SC_WireLoad * pWL, int nFanoutMax )
{
    Vec_Flt_t * vCaps = NULL;
    float EntryPrev, EntryCur, Slope;
    int i, iPrev, k, Entry, EntryMax;
    assert( pWL != NULL );
    // find the biggest fanout count
    EntryMax = 0;
    Vec_IntForEachEntry( &pWL->vFanout, Entry, i )
        EntryMax = Abc_MaxInt( EntryMax, Entry );
    // create the array
    vCaps = Vec_FltStart( Abc_MaxInt(nFanoutMax, EntryMax) + 1 );
    Vec_IntForEachEntry( &pWL->vFanout, Entry, i )
        Vec_FltWriteEntry( vCaps, Entry, Vec_FltEntry(&pWL->vLen, i) * pWL->cap );
    if ( Vec_FltEntry(vCaps, 1) == 0 )
        return vCaps;
    // interpolate between the values
    assert( Vec_FltEntry(vCaps, 1) != 0 );
    iPrev = 1;
    EntryPrev = Vec_FltEntry(vCaps, 1);
    Vec_FltForEachEntryStart( vCaps, EntryCur, i, 2 )
    {
        if ( EntryCur == 0 )
            continue;
        Slope = (EntryCur - EntryPrev) / (i - iPrev);
        for ( k = iPrev + 1; k < i; k++ )
            Vec_FltWriteEntry( vCaps, k, EntryPrev + Slope * (k - iPrev) );
        EntryPrev = EntryCur;
        iPrev = i;
    }
    // extrapolate after the largest value
    Slope = pWL->cap * pWL->slope;
    for ( k = iPrev + 1; k < i; k++ )
        Vec_FltWriteEntry( vCaps, k, EntryPrev + Slope * (k - iPrev) );
    // show
//    Vec_FltForEachEntry( vCaps, EntryCur, i )
//        printf( "%3d : %f\n", i, EntryCur );
    return vCaps;
}